

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::CommandBuffer>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  Handle<(vk::HandleType)24> HVar1;
  deUint32 dVar2;
  DeviceInterface *vk;
  VkDevice device;
  VkCommandBufferLevel VVar3;
  Unique<vk::VkCommandBuffer_s_*> obj2;
  Unique<vk::VkCommandBuffer_s_*> obj1;
  Unique<vk::VkCommandBuffer_s_*> obj0;
  Handle<(vk::HandleType)24> local_108;
  DeviceInterface *pDStack_100;
  VkCommandPool local_f8;
  VkCommandBufferLevel VStack_f0;
  deUint32 dStack_ec;
  Move<vk::VkCommandBuffer_s_*> local_e8;
  Move<vk::VkCommandBuffer_s_*> local_c8;
  VkCommandBuffer_s *local_a8;
  DeviceInterface *pDStack_a0;
  VkDevice local_98;
  deUint64 dStack_90;
  VkCommandPool local_78;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_70;
  Move<vk::VkCommandBuffer_s_*> local_58;
  
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  dVar2 = Context::getUniversalQueueFamilyIndex(context);
  local_a8 = (VkCommandBuffer_s *)
             CONCAT44(local_a8._4_4_,VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO);
  pDStack_a0 = (DeviceInterface *)0x0;
  local_98._4_4_ = dVar2;
  local_98._0_4_ = params.commandPool.flags.flags;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_108,vk,device,
             (VkCommandPoolCreateInfo *)&local_a8,(VkAllocationCallbacks *)0x0);
  HVar1.m_internal = local_108.m_internal;
  local_78.m_internal = local_108.m_internal;
  DStack_70.m_deviceIface = pDStack_100;
  DStack_70.m_device = (VkDevice)local_f8.m_internal;
  local_108.m_internal._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  pDStack_100 = (DeviceInterface *)0x0;
  local_f8.m_internal = HVar1.m_internal;
  VVar3 = params.level;
  dStack_ec = 1;
  VStack_f0 = VVar3;
  ::vk::allocateCommandBuffer(&local_c8,vk,device,(VkCommandBufferAllocateInfo *)&local_108);
  local_a8 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  pDStack_a0 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_98 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  dStack_90 = local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.m_internal._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  pDStack_100 = (DeviceInterface *)0x0;
  local_f8.m_internal = local_78.m_internal;
  dStack_ec = 1;
  VStack_f0 = VVar3;
  ::vk::allocateCommandBuffer(&local_e8,vk,device,(VkCommandBufferAllocateInfo *)&local_108);
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.m_internal._0_4_ = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  pDStack_100 = (DeviceInterface *)0x0;
  local_f8.m_internal = local_78.m_internal;
  dStack_ec = 1;
  VStack_f0 = VVar3;
  ::vk::allocateCommandBuffer(&local_58,vk,device,(VkCommandBufferAllocateInfo *)&local_108);
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_108.m_internal._0_4_ = 0x28;
  pDStack_100 = (DeviceInterface *)0x0;
  local_f8.m_internal = local_78.m_internal;
  dStack_ec = 1;
  VStack_f0 = VVar3;
  ::vk::allocateCommandBuffer(&local_58,vk,device,(VkCommandBufferAllocateInfo *)&local_108);
  if (local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108.m_internal = (deUint64)local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_58.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108.m_internal = (deUint64)local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_e8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object != (VkCommandBuffer_s *)0x0) {
    local_108.m_internal = (deUint64)local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
    (*(local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface,
               local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
               local_c8.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal,1);
  }
  if (local_a8 != (VkCommandBuffer_s *)0x0) {
    local_108.m_internal = (deUint64)local_a8;
    (*pDStack_a0->_vptr_DeviceInterface[0x48])(pDStack_a0,local_98,dStack_90,1);
  }
  local_108.m_internal = (deUint64)&local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_108.m_internal,
             (long)&pDStack_100->_vptr_DeviceInterface + local_108.m_internal);
  if ((VkCommandPool *)local_108.m_internal != &local_f8) {
    operator_delete((void *)local_108.m_internal,(ulong)(local_f8.m_internal + 1));
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_70,local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}